

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifSat.c
# Opt level: O0

void If_ManSatTest3(void)

{
  uint set;
  sat_solver *s;
  word *pTruth_00;
  Vec_Int_t *vLits_00;
  uint uSet;
  Vec_Int_t *vLits;
  word *pTruth;
  char *pDsd;
  sat_solver *p;
  int nLutSize;
  int nVars;
  
  s = (sat_solver *)If_ManSatBuildXY(4);
  pTruth_00 = Dau_DsdToTruth("0123456789ABCDEF{abcdef}",6);
  vLits_00 = Vec_IntAlloc(100);
  set = If_ManSatCheckXYall(s,4,pTruth_00,6,vLits_00);
  Dau_DecPrintSet(set,6,1);
  sat_solver_delete(s);
  Vec_IntFree(vLits_00);
  return;
}

Assistant:

void If_ManSatTest3()
{
    int nVars = 6;
    int nLutSize = 4;
    sat_solver * p = (sat_solver *)If_ManSatBuildXY( nLutSize );
//    char * pDsd = "(abcdefg)";
//    char * pDsd = "([a!bc]d!e)";
    char * pDsd = "0123456789ABCDEF{abcdef}";
    word * pTruth = Dau_DsdToTruth( pDsd, nVars );
    Vec_Int_t * vLits = Vec_IntAlloc( 100 );
//    unsigned uSet = (1 << 0) | (1 << 2) | (1 << 4) | (1 << 6);
//    unsigned uSet = (3 << 0) | (1 << 2) | (1 << 8) | (1 << 4);
    unsigned uSet = (1 << 0) | (3 << 2) | (1 << 4) | (1 << 6);
    uSet = If_ManSatCheckXYall( p, nLutSize, pTruth, nVars, vLits );
    Dau_DecPrintSet( uSet, nVars, 1 );

    sat_solver_delete(p);
    Vec_IntFree( vLits );
}